

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::renderUI(Sandbox *this)

{
  Shader *pSVar1;
  vec<3,_float,_(glm::qualifier)0> *pvVar2;
  vec2 vVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  GLuint GVar10;
  WindowStyle WVar11;
  size_type sVar12;
  pointer ppVar13;
  pointer ppVar14;
  size_type sVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  vec2 vVar18;
  reference ppFVar19;
  reference ppPVar20;
  reference pvVar21;
  Fbo *pFVar22;
  reference pvVar23;
  pointer ppVar24;
  mat4 *_value;
  Vbo *pVVar25;
  glm *this_00;
  pointer this_01;
  char *pcVar26;
  size_type sVar27;
  vec<3,_float,_(glm::qualifier)0> *in_RCX;
  BuffersList *this_02;
  DoubleBuffersList *this_03;
  FloodList *this_04;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float _near;
  float _far;
  float _near_00;
  __type_conflict _Var32;
  char *local_1358;
  char *local_1340;
  char *local_12f8;
  char *local_12e0;
  allocator local_eb9;
  string local_eb8;
  allocator local_e91;
  string local_e90;
  allocator local_e69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  allocator local_e01;
  string local_e00;
  allocator local_dd9;
  string local_dd8;
  allocator local_db1;
  string local_db0;
  allocator local_d89;
  string local_d88;
  allocator local_d61;
  string local_d60;
  allocator local_d39;
  string local_d38;
  allocator local_d11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  allocator local_ca9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  allocator local_c41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  allocator local_bd9;
  string local_bd8;
  allocator local_bb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  allocator local_b49;
  string local_b48;
  allocator local_b21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  allocator local_ab9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  vec<2,_float,_(glm::qualifier)0> local_a58;
  vec<2,_float,_(glm::qualifier)0> local_a50;
  Camera *local_a48;
  Camera *cam_1;
  float local_a38;
  float y_2;
  float x_2;
  float yStep_3;
  float xStep_3;
  float h_4;
  float w_5;
  allocator local_9f9;
  string local_9f8;
  vec<2,_float,_(glm::qualifier)0> local_9d8;
  vec<2,_float,_(glm::qualifier)0> local_9d0;
  Camera *local_9c8;
  Camera *cam;
  float local_9b8;
  float y_1;
  float x_1;
  float yStep_2;
  float xStep_2;
  float h_3;
  float w_4;
  vec<4,_float,_(glm::qualifier)0> local_97c;
  allocator local_969;
  string local_968;
  undefined1 local_948 [79];
  allocator local_8f9;
  string local_8f8;
  Shader *local_8d8;
  Shader *fill;
  Mesh local_8c0;
  unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_> local_818;
  allocator local_809;
  string local_808;
  allocator local_7e1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  mat<4,_4,_float,_(glm::qualifier)0> local_76c;
  allocator local_729;
  string local_728;
  mat<4,_4,_float,_(glm::qualifier)0> local_704;
  allocator local_6c1;
  string local_6c0;
  mat<4,_4,_float,_(glm::qualifier)0> local_69c;
  allocator local_659;
  string local_658;
  vec<3,_float,_(glm::qualifier)0> local_638;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  float local_568;
  float local_564;
  float y;
  float x;
  float h_2;
  float w_3;
  float p;
  allocator local_529;
  string local_528;
  allocator local_501;
  string local_500;
  allocator local_4d9;
  key_type local_4d8;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  key_type local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  vec<3,_float,_(glm::qualifier)0> *local_428;
  size_t i_4;
  string local_418;
  allocator local_3f1;
  key_type local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  key_type local_3a0;
  allocator local_379;
  string local_378;
  _Self local_358;
  _Self local_350;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_308;
  float local_304;
  vec2 scale_5;
  vec2 offset_3;
  size_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  ulong local_2b0;
  size_t j;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_2a0;
  float w_2;
  vec2 scale_4;
  vec2 offset_2;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_248;
  float local_244;
  vec2 scale_3;
  vec2 offset_1;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1f0;
  float local_1ec;
  vec2 scale_2;
  vec2 offset;
  size_t i;
  float yOffset_1;
  float xOffset_1;
  float yStep_1;
  float xStep_1;
  float scale_1;
  float h_1;
  float w_1;
  allocator local_191;
  key_type local_190;
  allocator local_169;
  key_type local_168;
  allocator local_141;
  key_type local_140;
  int local_120;
  allocator local_119;
  int nTotal_1;
  allocator local_f1;
  string local_f0;
  _Base_ptr local_d0;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
  local_c0;
  iterator local_b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
  local_b0;
  const_iterator slit;
  float imgW;
  float imgAspect;
  _Self local_98;
  iterator it;
  float yOffset;
  float xOffset;
  float yStep;
  float xStep;
  float scale;
  float a;
  float h;
  float w;
  int local_48;
  int nTotal;
  allocator local_31;
  string local_30;
  Sandbox *local_10;
  Sandbox *this_local;
  
  local_10 = this;
  bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"renderUI",&local_31);
    Tracker::begin(&(this->uniforms).tracker,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  if ((this->m_showTextures & 1U) != 0) {
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::size(&(this->uniforms).super_Scene.textures);
    local_48 = (int)sVar12;
    if (0 < local_48) {
      glDisable(0xb71);
      bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar6) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&w,"renderUI:textures",(allocator *)((long)&h + 3));
        Tracker::begin(&(this->uniforms).tracker,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::allocator<char>::~allocator((allocator<char> *)((long)&h + 3));
      }
      iVar7 = vera::getWindowWidth();
      iVar8 = vera::getWindowHeight();
      fVar28 = (float)iVar8;
      _Var32 = std::fmin<float,double>(1.0 / (float)local_48,0.25);
      fVar29 = (float)iVar7 * (float)(_Var32 * 0.5) * (fVar28 / (float)iVar7);
      fVar30 = fVar28 * (float)(_Var32 * 0.5);
      it._M_node._4_4_ = fVar28 - fVar30;
      vera::textAngle(0.0,(Font *)0x0);
      vera::textAlign(ALIGN_TOP,(Font *)0x0);
      vera::textAlign(ALIGN_LEFT,(Font *)0x0);
      fVar28 = vera::getPixelDensity(false);
      vera::textSize((fVar29 * 0.2) / fVar28,(Font *)0x0);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::begin(&(this->uniforms).super_Scene.textures);
      while( true ) {
        _imgW = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                ::end(&(this->uniforms).super_Scene.textures);
        bVar6 = std::operator!=(&local_98,(_Self *)&imgW);
        if (!bVar6) break;
        ppVar13 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                  ::operator->(&local_98);
        iVar7 = (*ppVar13->second->_vptr_Texture[0xc])();
        ppVar13 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                  ::operator->(&local_98);
        iVar8 = (*ppVar13->second->_vptr_Texture[0xd])();
        slit._M_node._4_4_ = (float)iVar7 / (float)iVar8;
        slit._M_node._0_4_ = fVar29 * slit._M_node._4_4_;
        ppVar13 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                  ::operator->(&local_98);
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
             ::find(&(this->uniforms).super_Scene.streams,&ppVar13->first);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
        ::_Rb_tree_const_iterator(&local_b0,&local_b8);
        local_c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
             ::end(&(this->uniforms).super_Scene.streams);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
        ::_Rb_tree_const_iterator(&local_c0,&local_c8);
        bVar6 = std::operator!=(&local_b0,&local_c0);
        if (bVar6) {
          ppVar14 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                    ::operator->(&local_b0);
          vera::image(ppVar14->second,fVar29 * 0.5 + slit._M_node._0_4_ * 0.5,it._M_node._4_4_,
                      slit._M_node._0_4_,fVar30,true);
        }
        else {
          ppVar13 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                    ::operator->(&local_98);
          vera::image(ppVar13->second,fVar29 * 0.5 + slit._M_node._0_4_ * 0.5,it._M_node._4_4_,
                      slit._M_node._0_4_,fVar30);
        }
        ppVar13 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                  ::operator->(&local_98);
        iVar7 = vera::getWindowHeight();
        vera::text(&ppVar13->first,0.0,((float)iVar7 - it._M_node._4_4_) - fVar30,(Font *)0x0);
        in_RCX = (vec<3,_float,_(glm::qualifier)0> *)0x8000000000000000;
        it._M_node._4_4_ = -fVar30 + -fVar30 + it._M_node._4_4_;
        local_d0 = (_Base_ptr)
                   std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
                   ::operator++(&local_98,0);
      }
      bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
      if (bVar6) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f0,"renderUI:textures",&local_f1);
        Tracker::end(&(this->uniforms).tracker,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
    }
  }
  if ((this->m_showPasses & 1U) != 0) {
    glDisable(0xb71);
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&nTotal_1,"renderUI:buffers",&local_119);
      Tracker::begin(&(this->uniforms).tracker,(string *)&nTotal_1);
      std::__cxx11::string::~string((string *)&nTotal_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    sVar15 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&(this->uniforms).buffers)
    ;
    local_120 = (int)sVar15;
    sVar15 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                       (&(this->uniforms).doubleBuffers);
    local_120 = local_120 + (int)sVar15;
    sVar15 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size
                       (&(this->uniforms).pyramids);
    local_120 = local_120 + (int)sVar15;
    sVar15 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::size(&(this->uniforms).floods);
    local_120 = local_120 + (int)sVar15;
    sVar16 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
             ::size(&(this->uniforms).super_Scene.models);
    if (sVar16 != 0) {
      local_120 = local_120 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,"u_scene",&local_141);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_140);
      local_120 = local_120 + (pmVar17->present & 1);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"u_sceneDepth",&local_169);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_168);
      local_120 = (uint)(pmVar17->present & 1) + local_120;
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"u_sceneNormal",&local_191);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](&(this->uniforms).functions,&local_190);
    local_120 = local_120 + (pmVar17->present & 1);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&w_1,"u_scenePosition",(allocator *)((long)&h_1 + 3));
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](&(this->uniforms).functions,(key_type *)&w_1);
    local_120 = (uint)(pmVar17->present & 1) + local_120;
    std::__cxx11::string::~string((string *)&w_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&h_1 + 3));
    in_RCX = (vec<3,_float,_(glm::qualifier)0> *)SceneRender::getBuffersTotal(&this->m_sceneRender);
    local_120 = local_120 + (int)in_RCX;
    if (0 < local_120) {
      iVar7 = vera::getWindowWidth();
      iVar8 = vera::getWindowHeight();
      _Var32 = std::fmin<float,double>(1.0 / (float)local_120,0.25);
      fVar28 = (float)iVar7 * (float)(_Var32 * 0.5);
      fVar29 = (float)iVar8 * (float)(_Var32 * 0.5);
      fVar30 = (float)iVar7 - fVar28;
      i._0_4_ = (float)iVar8 - fVar29;
      vera::textAngle(0.0,(Font *)0x0);
      fVar31 = vera::getPixelDensity(false);
      vera::textSize((fVar28 * 0.2) / fVar31,(Font *)0x0);
      vera::textAlign(ALIGN_TOP,(Font *)0x0);
      vera::textAlign(ALIGN_LEFT,(Font *)0x0);
      offset.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      offset.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      for (; vVar3 = offset,
          vVar18 = (vec2)std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size
                                   (&(this->uniforms).buffers), (ulong)vVar3 < (ulong)vVar18;
          offset = (vec2)((long)offset + 1)) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec(&scale_2,fVar30,(float)i);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_1f0,fVar29);
        this_02 = &(this->uniforms).buffers;
        ppFVar19 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                             (this_02,(size_type)offset);
        iVar7 = (*(*ppFVar19)->_vptr_Fbo[5])();
        ppFVar19 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                             (this_02,(size_type)offset);
        iVar8 = (*(*ppFVar19)->_vptr_Fbo[6])();
        local_1f0.x = local_1f0.x * ((float)iVar7 / (float)iVar8);
        scale_2.field_0.x = scale_2.field_0.x + (fVar28 - local_1f0.x);
        ppFVar19 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                             (this_02,(size_type)offset);
        vera::image(*ppFVar19,scale_2.field_0.x,scale_2.field_1.y,local_1f0.x,local_1ec);
        vera::toString<unsigned_long>((string *)&i_1,(unsigned_long *)&offset);
        std::operator+(&local_210,"u_buffer",(string *)&i_1);
        fVar31 = fVar30 - local_1f0.x;
        iVar7 = vera::getWindowHeight();
        vera::text(&local_210,fVar31,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&i_1);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      offset_1.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      offset_1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      for (; vVar3 = offset_1,
          vVar18 = (vec2)std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                                   (&(this->uniforms).doubleBuffers), (ulong)vVar3 < (ulong)vVar18;
          offset_1 = (vec2)((long)offset_1 + 1)) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec(&scale_3,fVar30,(float)i);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_248,fVar29);
        this_03 = &(this->uniforms).doubleBuffers;
        ppPVar20 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                             (this_03,(size_type)offset_1);
        iVar7 = (*(*ppPVar20)->src->_vptr_Fbo[5])();
        ppPVar20 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                             (this_03,(size_type)offset_1);
        iVar8 = (*(*ppPVar20)->src->_vptr_Fbo[6])();
        local_248.x = local_248.x * ((float)iVar7 / (float)iVar8);
        scale_3.field_0.x = scale_3.field_0.x + (fVar28 - local_248.x);
        ppPVar20 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                             (this_03,(size_type)offset_1);
        vera::image((*ppPVar20)->src,scale_3.field_0.x,scale_3.field_1.y,local_248.x,local_244);
        vera::toString<unsigned_long>((string *)&i_2,(unsigned_long *)&offset_1);
        std::operator+(&local_268,"u_doubleBuffer",(string *)&i_2);
        fVar31 = fVar30 - local_248.x;
        iVar7 = vera::getWindowHeight();
        vera::text(&local_268,fVar31,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&i_2);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      offset_2.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      offset_2.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      for (; vVar3 = offset_2,
          vVar18 = (vec2)std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size
                                   (&(this->uniforms).pyramids), (ulong)vVar3 < (ulong)vVar18;
          offset_2 = (vec2)((long)offset_2 + 1)) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec(&scale_4,fVar30,(float)i);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_2a0,fVar29);
        pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                            (&(this->uniforms).pyramids,(size_type)offset_2);
        iVar7 = (*pvVar21->_vptr_Pyramid[2])();
        pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                            (&(this->uniforms).pyramids,(size_type)offset_2);
        iVar8 = (*pvVar21->_vptr_Pyramid[3])();
        j._4_4_ = ((float)iVar7 / (float)iVar8) * local_2a0.x;
        scale_4.field_0.x = (fVar28 - j._4_4_) + scale_4.field_0.x;
        local_2b0 = 0;
        local_2a0.x = j._4_4_;
        while( true ) {
          uVar4 = local_2b0;
          pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                              (&(this->uniforms).pyramids,(size_type)offset_2);
          uVar9 = vera::Pyramid::getDepth(pvVar21);
          uVar5 = local_2b0;
          if (uVar9 << 1 <= uVar4) break;
          pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                              (&(this->uniforms).pyramids,(size_type)offset_2);
          uVar9 = vera::Pyramid::getDepth(pvVar21);
          if (uVar5 < uVar9) {
            pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                                (&(this->uniforms).pyramids,(size_type)offset_2);
            pFVar22 = vera::Pyramid::getResult(pvVar21,(uint)local_2b0);
            vera::image(pFVar22,scale_4.field_0.x,scale_4.field_1.y,local_2a0.x,w_2);
          }
          else {
            pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                                (&(this->uniforms).pyramids,(size_type)offset_2);
            pFVar22 = vera::Pyramid::getResult(pvVar21,(uint)local_2b0);
            vera::image(pFVar22,j._4_4_ + j._4_4_ + scale_4.field_0.x,scale_4.field_1.y,local_2a0.x,
                        w_2);
          }
          uVar4 = local_2b0;
          scale_4.field_0.x = scale_4.field_0.x - local_2a0.x;
          pvVar21 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                              (&(this->uniforms).pyramids,(size_type)offset_2);
          uVar9 = vera::Pyramid::getDepth(pvVar21);
          if (uVar4 < uVar9) {
            glm::vec<2,float,(glm::qualifier)0>::operator*=
                      ((vec<2,float,(glm::qualifier)0> *)&local_2a0,0.5);
            scale_4.field_1.y = -fVar29 * 0.5 + (float)i;
          }
          else {
            scale_4.field_1.y = fVar29 * 0.5 + (float)i;
            glm::vec<2,float,(glm::qualifier)0>::operator*=
                      ((vec<2,float,(glm::qualifier)0> *)&local_2a0,2.0);
          }
          scale_4.field_0.x = scale_4.field_0.x - local_2a0.x;
          local_2b0 = local_2b0 + 1;
        }
        vera::toString<unsigned_long>((string *)&i_3,(unsigned_long *)&offset_2);
        std::operator+(&local_2d0,"u_pyramid0",(string *)&i_3);
        fVar31 = local_2a0.x + local_2a0.x;
        iVar7 = vera::getWindowHeight();
        vera::text(&local_2d0,fVar30 - fVar31,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&i_3);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      offset_3.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      offset_3.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      for (; vVar3 = offset_3,
          vVar18 = (vec2)std::vector<vera::Flood,_std::allocator<vera::Flood>_>::size
                                   (&(this->uniforms).floods), (ulong)vVar3 < (ulong)vVar18;
          offset_3 = (vec2)((long)offset_3 + 1)) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec(&scale_5,fVar30,(float)i);
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_308,fVar29);
        this_04 = &(this->uniforms).floods;
        pvVar23 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                            (this_04,(size_type)offset_3);
        iVar7 = (*((pvVar23->super_PingPong).dst)->_vptr_Fbo[5])();
        pvVar23 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                            (this_04,(size_type)offset_3);
        iVar8 = (*((pvVar23->super_PingPong).dst)->_vptr_Fbo[6])();
        local_308.x = local_308.x * ((float)iVar7 / (float)iVar8);
        scale_5.field_0.x = scale_5.field_0.x + (fVar28 - local_308.x);
        pvVar23 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                            (this_04,(size_type)offset_3);
        vera::image((pvVar23->super_PingPong).dst,scale_5.field_0.x,scale_5.field_1.y,local_308.x,
                    local_304);
        vera::toString<unsigned_long>((string *)&it_1,(unsigned_long *)&offset_3);
        std::operator+(&local_328,"u_flood",(string *)&it_1);
        fVar31 = fVar30 - local_308.x;
        iVar7 = vera::getWindowHeight();
        vera::text(&local_328,fVar31,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&it_1);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      sVar16 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
               ::size(&(this->uniforms).super_Scene.models);
      if (sVar16 != 0) {
        vera::fill(0.0);
        local_350._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
             ::begin(&(this->uniforms).super_Scene.lights);
        while( true ) {
          local_358._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
               ::end(&(this->uniforms).super_Scene.lights);
          bVar6 = std::operator!=(&local_350,&local_358);
          if (!bVar6) break;
          ppVar24 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                    ::operator->(&local_350);
          pFVar22 = vera::Light::getShadowMap(ppVar24->second);
          bVar6 = vera::Fbo::isAllocated(pFVar22);
          if (bVar6) {
            ppVar24 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                      ::operator->(&local_350);
            pFVar22 = vera::Light::getShadowMap(ppVar24->second);
            GVar10 = vera::Fbo::getDepthTextureId(pFVar22);
            if (GVar10 != 0) {
              ppVar24 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                        ::operator->(&local_350);
              pFVar22 = vera::Light::getShadowMap(ppVar24->second);
              ppVar24 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                        ::operator->(&local_350);
              fVar31 = vera::Light::getShadowMapFar(ppVar24->second);
              ppVar24 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                        ::operator->(&local_350);
              _near = vera::Light::getShadowMapNear(ppVar24->second);
              vera::imageDepth(pFVar22,fVar30,(float)i,fVar28,fVar29,fVar31,_near);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_378,"u_lightShadowMap",&local_379);
              iVar7 = vera::getWindowHeight();
              vera::text(&local_378,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
              std::__cxx11::string::~string((string *)&local_378);
              std::allocator<char>::~allocator((allocator<char> *)&local_379);
              i._0_4_ = -fVar29 + -fVar29 + (float)i;
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
          ::operator++(&local_350);
        }
        vera::fill(1.0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3a0,"u_scenePosition",&local_3a1);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_3a0);
      bVar6 = pmVar17->present;
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      if ((bVar6 & 1U) != 0) {
        vera::image(&(this->m_sceneRender).positionFbo,fVar30,(float)i,fVar28,fVar29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3c8,"u_scenePosition",&local_3c9);
        iVar7 = vera::getWindowHeight();
        vera::text(&local_3c8,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"u_sceneNormal",&local_3f1);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_3f0);
      bVar6 = pmVar17->present;
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if ((bVar6 & 1U) != 0) {
        vera::image(&(this->m_sceneRender).normalFbo,fVar30,(float)i,fVar28,fVar29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_418,"u_sceneNormal",(allocator *)((long)&i_4 + 7));
        iVar7 = vera::getWindowHeight();
        vera::text(&local_418,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_4 + 7));
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      for (local_428 = (vec<3,_float,_(glm::qualifier)0> *)0x0; pvVar2 = local_428,
          in_RCX = (vec<3,_float,_(glm::qualifier)0> *)
                   std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size
                             (&(this->m_sceneRender).buffersFbo), pvVar2 < in_RCX;
          local_428 = (vec<3,_float,_(glm::qualifier)0> *)((long)&local_428->field_0 + 1)) {
        ppFVar19 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                             (&(this->m_sceneRender).buffersFbo,(size_type)local_428);
        vera::image(*ppFVar19,fVar30,(float)i,fVar28,fVar29);
        vera::toString<unsigned_long>(&local_468,(unsigned_long *)&local_428);
        std::operator+(&local_448,"u_sceneBuffer",&local_468);
        iVar7 = vera::getWindowHeight();
        vera::text(&local_448,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_488,"u_scene",&local_489);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_488);
      bVar6 = pmVar17->present;
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator((allocator<char> *)&local_489);
      if ((bVar6 & 1U) != 0) {
        vera::image(&(this->m_sceneRender).renderFbo,fVar30,(float)i,fVar28,fVar29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4b0,"u_scene",&local_4b1);
        iVar7 = vera::getWindowHeight();
        vera::text(&local_4b0,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        in_RCX = (vec<3,_float,_(glm::qualifier)0> *)0x8000000000000000;
        i._0_4_ = -fVar29 + -fVar29 + (float)i;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4d8,"u_sceneDepth",&local_4d9);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](&(this->uniforms).functions,&local_4d8);
      bVar6 = pmVar17->present;
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
      if ((bVar6 & 1U) != 0) {
        vera::fill(0.0);
        if ((this->uniforms).super_Scene.activeCamera != (Camera *)0x0) {
          (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4d])();
          (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4e])();
          vera::imageDepth(&(this->m_sceneRender).renderFbo,fVar30,(float)i,fVar28,fVar29,_far,
                           _near_00);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_500,"u_sceneDepth",&local_501);
        iVar7 = vera::getWindowHeight();
        vera::text(&local_500,fVar30 - fVar28,((float)iVar7 - (float)i) - fVar29,(Font *)0x0);
        std::__cxx11::string::~string((string *)&local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
        in_RCX = (vec<3,_float,_(glm::qualifier)0> *)0x8000000000000000;
        vera::fill(1.0);
      }
    }
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_528,"renderUI:buffers",&local_529);
      Tracker::end(&(this->uniforms).tracker,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator((allocator<char> *)&local_529);
    }
  }
  if ((this->m_plot != PLOT_OFF) && (this->m_plot_texture != (Texture *)0x0)) {
    glDisable(0xb71);
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&p,"renderUI:plot_data",(allocator *)((long)&w_3 + 3));
      Tracker::begin(&(this->uniforms).tracker,(string *)&p);
      std::__cxx11::string::~string((string *)&p);
      std::allocator<char>::~allocator((allocator<char> *)((long)&w_3 + 3));
    }
    h_2 = vera::getPixelDensity(false);
    x = h_2 * 100.0;
    y = h_2 * 30.0;
    iVar7 = vera::getWindowWidth();
    local_564 = (float)iVar7 * 0.5;
    local_568 = y + 10.0;
    vera::Shader::use(&this->m_plot_shader);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_588,"u_scale",&local_589);
    vera::Shader::setUniform(&this->m_plot_shader,&local_588,x,y);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator((allocator<char> *)&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5b0,"u_translate",&local_5b1);
    vera::Shader::setUniform(&this->m_plot_shader,&local_5b0,local_564,local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d8,"u_resolution",&local_5d9);
    iVar7 = vera::getWindowWidth();
    iVar8 = vera::getWindowHeight();
    vera::Shader::setUniform(&this->m_plot_shader,&local_5d8,(float)iVar7,(float)iVar8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_600,"u_viewport",&local_601);
    vera::Shader::setUniform(&this->m_plot_shader,&local_600,x,y);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_628,"u_model",&local_629);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_638,1.0);
    vera::Shader::setUniform(&this->m_plot_shader,&local_628,&local_638);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_658,"u_modelMatrix",&local_659);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_69c,1.0);
    vera::Shader::setUniform(&this->m_plot_shader,&local_658,&local_69c,false);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6c0,"u_viewMatrix",&local_6c1);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_704,1.0);
    vera::Shader::setUniform(&this->m_plot_shader,&local_6c0,&local_704,false);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_728,"u_projectionMatrix",&local_729);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_76c,1.0);
    vera::Shader::setUniform(&this->m_plot_shader,&local_728,&local_76c,false);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_790,"u_modelViewProjectionMatrix",&local_791);
    _value = vera::getOrthoMatrix();
    vera::Shader::setUniform(&this->m_plot_shader,&local_790,_value,false);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator((allocator<char> *)&local_791);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b8,"u_plotData",&local_7b9);
    in_RCX = (vec<3,_float,_(glm::qualifier)0> *)0x0;
    vera::Shader::setUniformTexture(&this->m_plot_shader,&local_7b8,this->m_plot_texture,0);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
    pVVar25 = vera::getBillboard();
    vera::Vbo::render(pVVar25,&this->m_plot_shader);
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7e0,"renderUI:plot_data",&local_7e1);
      Tracker::end(&(this->uniforms).tracker,&local_7e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
    }
  }
  if (((this->cursor & 1U) != 0) && (bVar6 = vera::getMouseEntered(), bVar6)) {
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_808,"renderUI:cursor",&local_809);
      Tracker::begin(&(this->uniforms).tracker,&local_808);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator((allocator<char> *)&local_809);
    }
    bVar6 = std::operator==(&this->m_cross_vbo,(nullptr_t)0x0);
    if (bVar6) {
      pVVar25 = (Vbo *)operator_new(0x60);
      fill._3_1_ = 1;
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                ((vec<3,_float,_(glm::qualifier)0> *)((long)&fill + 4),0.0,0.0,0.0);
      vera::crossMesh(&local_8c0,(vec3 *)((long)&fill + 4),10.0);
      vera::Vbo::Vbo(pVVar25,&local_8c0);
      fill._3_1_ = 0;
      std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
      unique_ptr<std::default_delete<vera::Vbo>,void>
                ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&local_818,pVVar25);
      std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::operator=
                (&this->m_cross_vbo,&local_818);
      std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::~unique_ptr(&local_818);
      vera::Mesh::~Mesh(&local_8c0);
    }
    local_8d8 = vera::getFillShader();
    vera::Shader::use(local_8d8);
    pSVar1 = local_8d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8f8,"u_modelViewProjectionMatrix",&local_8f9);
    this_00 = (glm *)vera::getOrthoMatrix();
    fVar28 = vera::getMouseX();
    fVar29 = vera::getMouseY();
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)local_948,fVar28,fVar29,0.0);
    glm::translate<float,(glm::qualifier)0>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_948 + 0xc),this_00,
               (mat<4,_4,_float,_(glm::qualifier)0> *)local_948,in_RCX);
    vera::Shader::setUniform(pSVar1,&local_8f8,(mat4 *)(local_948 + 0xc),false);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
    pSVar1 = local_8d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_968,"u_color",&local_969);
    glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_97c,1.0);
    vera::Shader::setUniform(pSVar1,&local_968,&local_97c);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator((allocator<char> *)&local_969);
    this_01 = std::unique_ptr<vera::Vbo,_std::default_delete<vera::Vbo>_>::operator->
                        (&this->m_cross_vbo);
    vera::Vbo::render(this_01,local_8d8);
    bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&w_4,"renderUI:cursor",(allocator *)((long)&h_3 + 3));
      Tracker::end(&(this->uniforms).tracker,(string *)&w_4);
      std::__cxx11::string::~string((string *)&w_4);
      std::allocator<char>::~allocator((allocator<char> *)((long)&h_3 + 3));
    }
  }
  if ((((this->frag_index == -1) && (this->vert_index == -1)) && (this->geom_index == -1)) &&
     (WVar11 = vera::getWindowStyle(), WVar11 != EMBEDDED)) {
    iVar7 = vera::getWindowWidth();
    xStep_2 = (float)iVar7;
    iVar7 = vera::getWindowHeight();
    yStep_2 = (float)iVar7;
    x_1 = xStep_2 * 0.05;
    y_1 = yStep_2 * 0.05;
    local_9b8 = x_1 + x_1;
    cam._4_4_ = y_1 * 3.0;
    local_9c8 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_9d0,xStep_2 * 0.5,yStep_2 * 0.5);
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              (&local_9d8,xStep_2 - (x_1 + x_1),yStep_2 - (y_1 + y_1));
    vera::rect(&local_9d0,&local_9d8,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_CENTER,(Font *)0x0);
    vera::textSize(38.0,(Font *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f8,"Drag & Drop",&local_9f9);
    vera::text(&local_9f8,xStep_2 * 0.5,yStep_2 * 0.45,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    vera::textSize(22.0,(Font *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&w_5,".vert .frag .ply .lst .obj .gltf .glb",(allocator *)((long)&h_4 + 3))
    ;
    vera::text((string *)&w_5,xStep_2 * 0.5,yStep_2 * 0.55,(Font *)0x0);
    std::__cxx11::string::~string((string *)&w_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&h_4 + 3));
    vera::setCamera(local_9c8);
  }
  if ((this->help & 1U) != 0) {
    iVar7 = vera::getWindowWidth();
    xStep_3 = (float)iVar7;
    iVar7 = vera::getWindowHeight();
    yStep_3 = (float)iVar7;
    x_2 = xStep_3 * 0.05;
    y_2 = yStep_3 * 0.05;
    local_a38 = x_2 * 2.0;
    cam_1._4_4_ = y_2 * 3.0;
    local_a48 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_a50,xStep_3 * 0.5,yStep_3 * 0.5);
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              (&local_a58,-x_2 + -x_2 + xStep_3,-y_2 + -y_2 + yStep_3);
    vera::rect(&local_a50,&local_a58,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textSize(22.0,(Font *)0x0);
    fVar28 = vera::getFontHeight();
    y_2 = fVar28 * 1.5;
    if (this->geom_index != -1) {
      if (((this->m_sceneRender).showAxis & 1U) == 0) {
        local_12e0 = "show";
      }
      else {
        local_12e0 = "hide";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ab8,local_12e0,&local_ab9);
      std::operator+(&local_a98,"a - ",&local_ab8);
      std::operator+(&local_a78,&local_a98," axis");
      vera::text(&local_a78,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
      if (((this->m_sceneRender).showBBoxes & 1U) == 0) {
        local_12f8 = "show";
      }
      else {
        local_12f8 = "hide";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b20,local_12f8,&local_b21);
      std::operator+(&local_b00,"b - ",&local_b20);
      std::operator+(&local_ae0,&local_b00," bounding boxes");
      vera::text(&local_ae0,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::~string((string *)&local_b00);
      std::__cxx11::string::~string((string *)&local_b20);
      std::allocator<char>::~allocator((allocator<char> *)&local_b21);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b48,"c - hide/show cursor",&local_b49);
    vera::text(&local_b48,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    cam_1._4_4_ = y_2 + cam_1._4_4_;
    if (this->geom_index != -1) {
      pcVar26 = "enable";
      if (((this->m_sceneRender).dynamicShadows & 1U) != 0) {
        pcVar26 = "disable";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_bb0,pcVar26,&local_bb1);
      std::operator+(&local_b90,"d - ",&local_bb0);
      std::operator+(&local_b70,&local_b90," dynamic shadows");
      vera::text(&local_b70,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_b70);
      std::__cxx11::string::~string((string *)&local_b90);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
      cam_1._4_4_ = cam_1._4_4_ + y_2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_bd8,"f - hide/show floor",&local_bd9);
      vera::text(&local_bd8,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    bVar6 = vera::isFullscreen();
    pcVar26 = "enable";
    if (bVar6) {
      pcVar26 = "disable";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c40,pcVar26,&local_c41);
    std::operator+(&local_c20,"F - ",&local_c40);
    std::operator+(&local_c00,&local_c20," fullscreen");
    vera::text(&local_c00,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_c00);
    std::__cxx11::string::~string((string *)&local_c20);
    std::__cxx11::string::~string((string *)&local_c40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c41);
    cam_1._4_4_ = y_2 + cam_1._4_4_;
    if (this->geom_index != -1) {
      if (((this->m_sceneRender).showGrid & 1U) == 0) {
        local_1340 = "show";
      }
      else {
        local_1340 = "hide";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ca8,local_1340,&local_ca9);
      std::operator+(&local_c88,"g - ",&local_ca8);
      std::operator+(&local_c68,&local_c88," grid");
      vera::text(&local_c68,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_c68);
      std::__cxx11::string::~string((string *)&local_c88);
      std::__cxx11::string::~string((string *)&local_ca8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    if ((this->help & 1U) == 0) {
      local_1358 = "show";
    }
    else {
      local_1358 = "hide";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d10,local_1358,&local_d11);
    std::operator+(&local_cf0,"h - ",&local_d10);
    std::operator+(&local_cd0,&local_cf0," help");
    vera::text(&local_cd0,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::__cxx11::string::~string((string *)&local_d10);
    std::allocator<char>::~allocator((allocator<char> *)&local_d11);
    cam_1._4_4_ = cam_1._4_4_ + y_2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d38,"i - hide/show extra info",&local_d39);
    vera::text(&local_d38,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_d38);
    std::allocator<char>::~allocator((allocator<char> *)&local_d39);
    cam_1._4_4_ = cam_1._4_4_ + y_2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d60,"o - open shaders on default editor",&local_d61);
    vera::text(&local_d60,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_d60);
    std::allocator<char>::~allocator((allocator<char> *)&local_d61);
    cam_1._4_4_ = cam_1._4_4_ + y_2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d88,"p - hide/show render passes/buffers",&local_d89);
    vera::text(&local_d88,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_d89);
    cam_1._4_4_ = y_2 + cam_1._4_4_;
    sVar27 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
             ::size(&(this->uniforms).super_Scene.streams);
    if (sVar27 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_db0,"r - restart stream textures",&local_db1);
      vera::text(&local_db0,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_db0);
      std::allocator<char>::~allocator((allocator<char> *)&local_db1);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    if (this->geom_index != -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_dd8,"s - hide/show sky",&local_dd9);
      vera::text(&local_dd8,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_dd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e00,"t - hide/show loaded textures",&local_e01);
    vera::text(&local_e00,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_e00);
    std::allocator<char>::~allocator((allocator<char> *)&local_e01);
    cam_1._4_4_ = cam_1._4_4_ + y_2;
    pcVar26 = "enable";
    if ((this->verbose & 1U) != 0) {
      pcVar26 = "disable";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e68,pcVar26,&local_e69);
    std::operator+(&local_e48,"v - ",&local_e68);
    std::operator+(&local_e28,&local_e48," verbose");
    vera::text(&local_e28,local_a38,cam_1._4_4_,(Font *)0x0);
    std::__cxx11::string::~string((string *)&local_e28);
    std::__cxx11::string::~string((string *)&local_e48);
    std::__cxx11::string::~string((string *)&local_e68);
    std::allocator<char>::~allocator((allocator<char> *)&local_e69);
    cam_1._4_4_ = y_2 + cam_1._4_4_;
    sVar27 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
             ::size(&(this->uniforms).super_Scene.streams);
    if (sVar27 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e90,"space - start/stop stream textures",&local_e91);
      vera::text(&local_e90,local_a38,cam_1._4_4_,(Font *)0x0);
      std::__cxx11::string::~string((string *)&local_e90);
      std::allocator<char>::~allocator((allocator<char> *)&local_e91);
      cam_1._4_4_ = y_2 + cam_1._4_4_;
    }
    vera::setCamera(local_a48);
    glDisable(0xb71);
  }
  bVar6 = Tracker::isRunning(&(this->uniforms).tracker);
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_eb8,"renderUI",&local_eb9);
    Tracker::end(&(this->uniforms).tracker,&local_eb8);
    std::__cxx11::string::~string((string *)&local_eb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  }
  return;
}

Assistant:

void Sandbox::renderUI() {
    TRACK_BEGIN("renderUI")

    // // IN PUT TEXTURES
    if (m_showTextures) {      

        int nTotal = uniforms.textures.size();
        if (nTotal > 0) {
            glDisable(GL_DEPTH_TEST);
            TRACK_BEGIN("renderUI:textures")
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float a = h/w;
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale * a;
            float yStep = h * scale;
            float xOffset = xStep;
            float yOffset = h - yStep;
            
            vera::textAngle(0.0);
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));

            for (vera::TexturesMap::iterator it = uniforms.textures.begin(); it != uniforms.textures.end(); it++) {
                float imgAspect = ((float)it->second->getWidth()/(float)it->second->getHeight());
                float imgW = xStep * imgAspect;
                vera::TextureStreamsMap::const_iterator slit = uniforms.streams.find(it->first);
                if ( slit != uniforms.streams.end() )
                    vera::image((vera::TextureStream*)slit->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep, true);
                else 
                    vera::image(it->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep);

                vera::text(it->first, 0, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }
            TRACK_END("renderUI:textures")
        }
    }

    // RESULTING BUFFERS
    if (m_showPasses) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:buffers")

        // DEBUG BUFFERS
        int nTotal = uniforms.buffers.size();
        nTotal += uniforms.doubleBuffers.size();
        nTotal += uniforms.pyramids.size();
        nTotal += uniforms.floods.size();
        if (uniforms.models.size() > 0 ) {
            nTotal += 1;
            nTotal += uniforms.functions["u_scene"].present;
            nTotal += uniforms.functions["u_sceneDepth"].present;
        }
        nTotal += uniforms.functions["u_sceneNormal"].present;
        nTotal += uniforms.functions["u_scenePosition"].present;
        nTotal += m_sceneRender.getBuffersTotal();
        
        if (nTotal > 0) {
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale;
            float yStep = h * scale;
            float xOffset = w - xStep;
            float yOffset = h - yStep;

            vera::textAngle(0.0);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);

            for (size_t i = 0; i < uniforms.buffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.buffers[i]->getWidth()/(float)uniforms.buffers[i]->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.buffers[i], offset.x, offset.y, scale.x, scale.y);
                vera::text("u_buffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.doubleBuffers[i]->src->getWidth()/(float)uniforms.doubleBuffers[i]->src->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.doubleBuffers[i]->src, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_doubleBuffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.pyramids.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.pyramids[i].getWidth()/(float)uniforms.pyramids[i].getHeight());
                float w = scale.x;
                offset.x += xStep - w;
                for (size_t j = 0; j < uniforms.pyramids[i].getDepth() * 2; j++ ) {

                    if (j < uniforms.pyramids[i].getDepth())
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x, offset.y, scale.x, scale.y);
                    else 
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x + w * 2.0f, offset.y, scale.x, scale.y);

                    offset.x -= scale.x;
                    if (j < uniforms.pyramids[i].getDepth()) {
                        scale *= 0.5;
                        offset.y = yOffset - yStep * 0.5;
                    }
                    else {
                        offset.y = yOffset + yStep * 0.5;
                        scale *= 2.0;
                    }
                    offset.x -= scale.x;

                }

                vera::text("u_pyramid0" + vera::toString(i), xOffset - scale.x * 2.0, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;

            }

            for (size_t i = 0; i < uniforms.floods.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.floods[i].dst->getWidth()/(float)uniforms.floods[i].dst->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.floods[i].dst, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_flood" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            if (uniforms.models.size() > 0) {
                vera::fill(0.0);
                for (vera::LightsMap::iterator it = uniforms.lights.begin(); it != uniforms.lights.end(); ++it ) {
                    if ( it->second->getShadowMap()->isAllocated() && it->second->getShadowMap()->getDepthTextureId() ) {
                        vera::imageDepth(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep, it->second->getShadowMapFar(), it->second->getShadowMapNear());
                        // vera::image(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep);
                        vera::text("u_lightShadowMap", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                        yOffset -= yStep * 2.0;
                    }
                }
                vera::fill(1.0);
            }

            if (uniforms.functions["u_scenePosition"].present) {
                vera::image(&m_sceneRender.positionFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scenePosition", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneNormal"].present) {
                vera::image(&m_sceneRender.normalFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneNormal", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < m_sceneRender.buffersFbo.size(); i++) {
                vera::image(m_sceneRender.buffersFbo[i], xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneBuffer" + vera::toString(i), xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_scene"].present) {
                vera::image(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scene", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneDepth"].present) {
                vera::fill(0.0);
                if (uniforms.activeCamera)
                    vera::imageDepth(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep, uniforms.activeCamera->getFarClip(), uniforms.activeCamera->getNearClip());
                vera::text("u_sceneDepth", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
                vera::fill(1.0);
            }
        }
        TRACK_END("renderUI:buffers")
    }

    if (m_plot != PLOT_OFF && m_plot_texture ) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:plot_data")

        float p = vera::getPixelDensity();
        float w = 100 * p;
        float h = 30 * p;
        float x = (float)(vera::getWindowWidth()) * 0.5;
        float y = h + 10;

        m_plot_shader.use();
        m_plot_shader.setUniform("u_scale", w, h);
        m_plot_shader.setUniform("u_translate", x, y);
        m_plot_shader.setUniform("u_resolution", (float)vera::getWindowWidth(), (float)vera::getWindowHeight());
        m_plot_shader.setUniform("u_viewport", w, h);
        m_plot_shader.setUniform("u_model", glm::vec3(1.0f));
        m_plot_shader.setUniform("u_modelMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_viewMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_projectionMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_modelViewProjectionMatrix", vera::getOrthoMatrix());
        m_plot_shader.setUniformTexture("u_plotData", m_plot_texture, 0);
        
        vera::getBillboard()->render(&m_plot_shader);
        TRACK_END("renderUI:plot_data")
    }

    if (cursor && vera::getMouseEntered()) {
        TRACK_BEGIN("renderUI:cursor")
        if (m_cross_vbo == nullptr)
            m_cross_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::crossMesh( glm::vec3(0.0f, 0.0f, 0.0f), 10.0f) ));

        vera::Shader* fill = vera::getFillShader();
        fill->use();
        fill->setUniform("u_modelViewProjectionMatrix", glm::translate(vera::getOrthoMatrix(), glm::vec3(vera::getMouseX(), vera::getMouseY(), 0.0f) ) );
        fill->setUniform("u_color", glm::vec4(1.0f));
        m_cross_vbo->render(fill);
        TRACK_END("renderUI:cursor")
    }

    if (frag_index == -1 && vert_index == -1 && geom_index == -1 && vera::getWindowStyle() != vera::EMBEDDED) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);

        vera::textAngle(0.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_CENTER);

        vera::textSize(38.0f);
        vera::text("Drag & Drop", w * 0.5f, h * 0.45f);

        vera::textSize(22.0f);
        vera::text(".vert .frag .ply .lst .obj .gltf .glb", w * 0.5f, h * 0.55f);

        vera::setCamera(cam);
    }

    if (help) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_LEFT);
        vera::textAngle(0.0f);
        vera::textSize(22.0f);
        yStep = vera::getFontHeight() * 1.5f;

        if (geom_index != -1) {
            vera::text("a - " + std::string( m_sceneRender.showAxis? "hide" : "show" ) + " axis", x, y);
            y += yStep;
            vera::text("b - " + std::string( m_sceneRender.showBBoxes? "hide" : "show" ) + " bounding boxes", x, y);
            y += yStep;
        }

        vera::text("c - hide/show cursor", x, y);
        y += yStep;

        if (geom_index != -1) {
            vera::text("d - " + std::string( m_sceneRender.dynamicShadows? "disable" : "enable" ) + " dynamic shadows", x, y);
            y += yStep;
            vera::text("f - hide/show floor", x, y);
            y += yStep;
        }
        vera::text("F - " + std::string( vera::isFullscreen() ? "disable" : "enable" ) + " fullscreen", x, y);
        y += yStep;
        if (geom_index != -1) {
            vera::text("g - " + std::string( m_sceneRender.showGrid? "hide" : "show" ) + " grid", x, y);
            y += yStep;
        }

        vera::text("h - " + std::string( help? "hide" : "show" ) + " help", x, y);
        y += yStep;
        vera::text("i - hide/show extra info", x, y);
        y += yStep;
        vera::text("o - open shaders on default editor", x, y);
        y += yStep;
        vera::text("p - hide/show render passes/buffers", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("r - restart stream textures", x, y);
            y += yStep;
        }

        if (geom_index != -1) {
            vera::text("s - hide/show sky", x, y);
            y += yStep;
        }

        vera::text("t - hide/show loaded textures", x, y);
        y += yStep;
        vera::text("v - " + std::string( verbose? "disable" : "enable" ) + " verbose", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("space - start/stop stream textures", x, y);
            y += yStep;
        }
        
        vera::setCamera(cam);
        glDisable(GL_DEPTH_TEST);
    }

    TRACK_END("renderUI")
}